

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O2

void draw_v_arrow(int x,int y1,int y2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = (uint)(y1 <= y2) * 2 + -1;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)(uint)x,y1,(ulong)(uint)y2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)(x - 4),(ulong)(uint)y2,(ulong)(x + 4));
  uVar2 = iVar3 * -5 + y2;
  uVar1 = y2 - iVar3;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
            (fl_graphics_driver,(ulong)(x - 2),(ulong)uVar2,(ulong)(uint)x,(ulong)uVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
            (fl_graphics_driver,(ulong)(x + 2),(ulong)uVar2,(ulong)(uint)x,(ulong)uVar1);
  return;
}

Assistant:

static void draw_v_arrow(int x, int y1, int y2) {
  int dy = (y1>y2) ? -1 : 1 ;
  fl_yxline(x, y1, y2);
  fl_xyline(x-4, y2, x+4);
  fl_line(x-2, y2-dy*5, x, y2-dy);
  fl_line(x+2, y2-dy*5, x, y2-dy);
}